

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O0

EExpr * __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::VisitCommonExpr(ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                  *this,Reference r)

{
  CStringRef msg;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  int *args;
  size_type sVar4;
  reference pvVar5;
  ExprBase e;
  SafeBool SVar6;
  int in_EDX;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_RSI;
  CStringRef in_RDI;
  MutCommonExpr MVar7;
  EExpr eexpr;
  bool dvelim;
  MutCommonExpr ce;
  int index;
  undefined4 in_stack_fffffffffffffb08;
  int in_stack_fffffffffffffb0c;
  ExprBase in_stack_fffffffffffffb10;
  BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  *in_stack_fffffffffffffb18;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffffb20;
  ExprBase other;
  vector<mp::EExpr,_std::allocator<mp::EExpr>_> *__new_size;
  vector<int,_std::allocator<int>_> *this_00;
  undefined2 in_stack_fffffffffffffb3c;
  undefined1 in_stack_fffffffffffffb3e;
  undefined1 uVar8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffb40;
  EExpr *pEVar9;
  undefined4 in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb64;
  LinearExpr *in_stack_fffffffffffffb68;
  ExprBase local_2c8;
  Impl local_2c0 [86];
  LinTerms *in_stack_fffffffffffffe98;
  EExpr *in_stack_fffffffffffffea0;
  BasicCStringRef<char> local_70 [6];
  BasicProblem<mp::BasicProblemParams<int>_> *local_40;
  int local_38;
  BasicProblem<mp::BasicProblemParams<int>_> *local_30;
  int local_28;
  int local_1c;
  Reference local_10 [2];
  
  pEVar9 = (EExpr *)in_RDI.data_;
  pcVar3 = Reference::index(local_10,(char *)in_RSI,in_EDX);
  local_1c = (int)pcVar3;
  (*(in_RSI->
    super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
    ).
    super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
    .
    super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
    ._vptr_BasicExprVisitor[0x12])();
  MVar7 = BasicProblem<mp::BasicProblemParams<int>_>::common_expr
                    (in_stack_fffffffffffffb20,(int)((ulong)in_stack_fffffffffffffb18 >> 0x20));
  local_40 = MVar7.
             super_BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
             .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_38 = MVar7.
             super_BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
             .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  local_30 = local_40;
  local_28 = local_38;
  bVar1 = BasicProblem<mp::BasicProblemParams<int>_>::
          BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          ::is_known((BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                      *)in_stack_fffffffffffffb10.impl_);
  if (bVar1) {
    iVar2 = defvarelim(in_RSI);
    bVar1 = true;
    if (iVar2 != 2) {
      iVar2 = defvarelim(in_RSI);
      in_stack_fffffffffffffb3e = false;
      bVar1 = (bool)in_stack_fffffffffffffb3e;
      if (iVar2 == 1) {
        iVar2 = BasicProblem<mp::BasicProblemParams<int>_>::
                BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                ::position((BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                            *)0x6197d7);
        in_stack_fffffffffffffb3e = iVar2 != 0;
        bVar1 = (bool)in_stack_fffffffffffffb3e;
      }
    }
    iVar2 = local_1c;
    uVar8 = bVar1;
    sVar4 = std::vector<int,_std::allocator<int>_>::size(&in_RSI->common_exprs_);
    if ((int)sVar4 <= iVar2) {
      this_00 = &in_RSI->common_exprs_;
      (*(in_RSI->
        super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
        ).
        super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
        .
        super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
        ._vptr_BasicExprVisitor[0x12])();
      BasicProblem<mp::BasicProblemParams<int>_>::num_common_exprs
                ((BasicProblem<mp::BasicProblemParams<int>_> *)0x61983c);
      std::vector<int,_std::allocator<int>_>::resize
                (in_stack_fffffffffffffb40,
                 CONCAT17(uVar8,CONCAT16(in_stack_fffffffffffffb3e,
                                         CONCAT24(in_stack_fffffffffffffb3c,iVar2))),
                 (value_type *)this_00);
      iVar2 = defvarelim(in_RSI);
      if (iVar2 != 0) {
        __new_size = &in_RSI->common_ee_;
        std::vector<int,_std::allocator<int>_>::size(&in_RSI->common_exprs_);
        std::vector<mp::EExpr,_std::allocator<mp::EExpr>_>::resize
                  ((vector<mp::EExpr,_std::allocator<mp::EExpr>_> *)this_00,(size_type)__new_size);
      }
    }
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&in_RSI->common_exprs_,(long)local_1c);
    if (*pvVar5 < 0) {
      BasicProblem<mp::BasicProblemParams<int>_>::
      BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
      ::linear_expr((BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                     *)0x6198c0);
      other.impl_ = local_2c0;
      ToLinTerms(in_stack_fffffffffffffb68);
      EExpr::EExpr(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      LinTerms::~LinTerms((LinTerms *)in_stack_fffffffffffffb10.impl_);
      e.impl_ = (Impl *)BasicProblem<mp::BasicProblemParams<int>_>::
                        BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                        ::nonlinear_expr(in_stack_fffffffffffffb18);
      local_2c8.impl_ = e.impl_;
      SVar6 = internal::ExprBase::operator_cast_to_function_pointer(&local_2c8);
      if (SVar6 != 0) {
        in_stack_fffffffffffffb10.impl_ =
             (Impl *)BasicProblem<mp::BasicProblemParams<int>_>::
                     BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                     ::nonlinear_expr((BasicCommonExpr<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                                       *)e.impl_);
        BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
        BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                  ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)e.impl_,
                   (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)other.impl_,
                   SUB84(in_stack_fffffffffffffb10.impl_,4));
        Convert2EExpr((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                       *)in_stack_fffffffffffffb10.impl_,(Expr)e.impl_);
        AlgebraicExpression<mp::QuadAndLinTerms>::add
                  ((AlgebraicExpression<mp::QuadAndLinTerms> *)in_stack_fffffffffffffb10.impl_,
                   (AlgebraicExpression<mp::QuadAndLinTerms> *)
                   CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
        EExpr::~EExpr((EExpr *)0x619993);
      }
      if (bVar1 == false) {
        in_stack_fffffffffffffb0c =
             Convert2Var((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                          *)in_stack_fffffffffffffb10.impl_,
                         (EExpr *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&in_RSI->common_exprs_,(long)local_1c);
        *pvVar5 = in_stack_fffffffffffffb0c;
      }
      else {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&in_RSI->common_exprs_,(long)local_1c);
        *pvVar5 = 0;
        std::vector<mp::EExpr,_std::allocator<mp::EExpr>_>::operator[]
                  (&in_RSI->common_ee_,(long)local_1c);
        EExpr::operator=((EExpr *)in_stack_fffffffffffffb10.impl_,
                         (EExpr *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
      }
      EExpr::~EExpr((EExpr *)0x619a86);
    }
    if (bVar1 == false) {
      std::vector<int,_std::allocator<int>_>::operator[](&in_RSI->common_exprs_,(long)local_1c);
      EExpr::EExpr((EExpr *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
                   (Variable)(int)((ulong)in_stack_fffffffffffffb10.impl_ >> 0x20));
    }
    else {
      std::vector<mp::EExpr,_std::allocator<mp::EExpr>_>::operator[]
                (&in_RSI->common_ee_,(long)local_1c);
      EExpr::EExpr((EExpr *)in_stack_fffffffffffffb10.impl_,
                   (EExpr *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
    }
    return pEVar9;
  }
  args = (int *)__cxa_allocate_exception(0x18);
  iVar2 = (int)((ulong)pEVar9 >> 0x20);
  fmt::BasicCStringRef<char>::BasicCStringRef
            (local_70,"Defined variable {} not provided in the input.\nPlease contact AMPL support."
            );
  fmt::format<int>(in_RDI,args);
  fmt::BasicCStringRef<char>::BasicCStringRef
            ((BasicCStringRef<char> *)in_stack_fffffffffffffb10.impl_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
  msg.data_._4_4_ = in_stack_fffffffffffffb64;
  msg.data_._0_4_ = in_stack_fffffffffffffb60;
  Error::Error((Error *)in_RSI,msg,iVar2);
  __cxa_throw(args,&Error::typeinfo,Error::~Error);
}

Assistant:

EExpr VisitCommonExpr(Reference r) {
    const auto index = r.index();
    auto ce = MP_DISPATCH( GetModel() ).common_expr(index);
    MP_ASSERT_ALWAYS(ce.is_known(),
                     fmt::format(
                         "Defined variable {} not provided in the input.\n"
                         "Please contact AMPL support.",
                         index));
    bool dvelim
        = 2==defvarelim()         // always inline
          || (1==defvarelim()
              && ce.position());  // used only 1x. @todo own ref count #153
    if (index >= (int)common_exprs_.size()) {
      assert(index < GetModel().num_common_exprs());
      common_exprs_.resize(
                  GetModel().num_common_exprs(),
                  -1);          // init by -1, "no variable"
      if (defvarelim())
        common_ee_.resize(common_exprs_.size());
    }
    if (common_exprs_[index]<0) {                 // not yet converted
      EExpr eexpr( ToLinTerms(ce.linear_expr()) );
      if (ce.nonlinear_expr())
        eexpr.add( Convert2EExpr(ce.nonlinear_expr()) );
      if (dvelim) {             // provide the eexpr itself
        common_exprs_[index] = 0;
        assert((int)common_ee_.size() > index);
        common_ee_[index] = std::move(eexpr);
      } else                            // convert 2 var
        common_exprs_[index] = Convert2Var(std::move(eexpr));
    }
    if (dvelim)
      return common_ee_[index];
    return EExpr::Variable{ common_exprs_[index] };
  }